

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O1

int Abc_SopGetLitNum(char *pSop)

{
  int iVar1;
  byte bVar2;
  byte *pbVar3;
  
  iVar1 = 0;
  if ((pSop != (char *)0x0) && (bVar2 = *pSop, iVar1 = 0, bVar2 != 0)) {
    pbVar3 = (byte *)(pSop + 1);
    iVar1 = 0;
    do {
      iVar1 = (iVar1 - (uint)(bVar2 == 10)) + (uint)((bVar2 & 0xfe) == 0x30);
      bVar2 = *pbVar3;
      pbVar3 = pbVar3 + 1;
    } while (bVar2 != 0);
  }
  return iVar1;
}

Assistant:

int Abc_SopGetLitNum( char * pSop )
{
    char * pCur;
    int nLits = 0;
    if ( pSop == NULL )
        return 0;
    for ( pCur = pSop; *pCur; pCur++ )
    {
        nLits  -= (*pCur == '\n');
        nLits  += (*pCur == '0' || *pCur == '1');
    }
    return nLits;
}